

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall Js::FunctionBody::DoRedeferFunction(FunctionBody *this,uint inactiveThreshold)

{
  int iVar1;
  FunctionInfo *pFVar2;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar3;
  EntryPointInfo *pEVar4;
  code *pcVar5;
  bool bVar6;
  ExecutionMode EVar7;
  State SVar8;
  uint32 uVar9;
  uint uVar10;
  uint uVar11;
  undefined4 *puVar12;
  long lVar13;
  void *pvVar14;
  ulong uVar15;
  long lVar16;
  bool local_31 [8];
  bool overflow;
  
  pFVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if ((FunctionBody *)(pFVar2->functionBodyImpl).ptr != this) {
    return false;
  }
  if (pFVar2 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x561,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar6) goto LAB_0076710e;
    *puVar12 = 0;
  }
  if ((FunctionBody *)
      (((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionBodyImpl)
      .ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x562,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar6) goto LAB_0076710e;
    *puVar12 = 0;
  }
  pFVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if ((pFVar2->attributes & CanDefer) == None) {
    return false;
  }
  if ((this->byteCodeBlock).ptr == (ByteBlock *)0x0) {
    return false;
  }
  if (this->m_depth != 0) {
    return false;
  }
  if ((*(ushort *)&this->field_0x17c & 0x200) != 0) {
    return false;
  }
  uVar10 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
              m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
  if (pFVar2 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar6) goto LAB_0076710e;
    *puVar12 = 0;
  }
  bVar6 = Phases::IsEnabled((Phases *)&DAT_015b0240,RedeferralPhase,uVar10,
                            ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                            ptr)->functionId);
  if (!bVar6) {
    uVar10 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
                m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
    if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar6) {
LAB_0076710e:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar12 = 0;
    }
    bVar6 = Phases::IsEnabled((Phases *)&DAT_015b30e0,RedeferralPhase,uVar10,
                              ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                              ptr)->functionId);
    if (!bVar6) {
      uVar10 = FunctionProxy::GetCompileCount((FunctionProxy *)this);
      if (DAT_015b8ee0 <= uVar10) {
        return false;
      }
      local_31[0] = false;
      if (1 < uVar10) {
        inactiveThreshold = JavascriptNumber::DirectPowIntInt(local_31,inactiveThreshold,uVar10);
      }
      uVar11 = 0xffffffff;
      if (local_31[0] == false) {
        uVar11 = inactiveThreshold;
      }
      if (this->inactiveCount < uVar11) {
        return false;
      }
    }
  }
  EVar7 = FunctionExecutionStateMachine::GetExecutionMode(&this->executionState);
  pSVar3 = (this->entryPoints).ptr;
  if (pSVar3 == (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                 *)0x0) {
    bVar6 = false;
  }
  else {
    iVar1 = (pSVar3->
            super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ).
            super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
            .count;
    bVar6 = 0 < iVar1;
    if (0 < iVar1) {
      bVar6 = true;
      lVar16 = 0;
      do {
        pEVar4 = (EntryPointInfo *)
                 (((pSVar3->
                   super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ).
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                   .buffer.ptr[lVar16].ptr)->super_RecyclerWeakReferenceBase).strongRef;
        if ((pEVar4 != (EntryPointInfo *)0x0) &&
           (((((SVar8 = EntryPointInfo::GetState(pEVar4), ProfilingInterpreter < EVar7 &&
               (SVar8 == CodeGenPending)) ||
              (SVar8 = EntryPointInfo::GetState(pEVar4), SVar8 == CodeGenQueued)) ||
             (SVar8 = EntryPointInfo::GetState(pEVar4), SVar8 == CodeGenRecorded)) ||
            ((SVar8 = EntryPointInfo::GetState(pEVar4), SVar8 == CodeGenDone &&
             ((pEVar4->field_0x18 & 0x10) == 0)))))) break;
        lVar16 = lVar16 + 1;
        lVar13 = (long)(pSVar3->
                       super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       ).
                       super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                       .count;
        bVar6 = lVar16 < lVar13;
      } while (lVar16 < lVar13);
    }
  }
  if (!bVar6) {
    pvVar14 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,LoopHeaderArray);
    if (pvVar14 != (void *)0x0) {
      uVar9 = GetCountField(this,LoopCount);
      bVar6 = uVar9 != 0;
      if (uVar9 == 0) goto LAB_007670ad;
      uVar15 = 0;
      do {
        lVar16 = *(long *)((long)pvVar14 + uVar15 * 0x30);
        if (lVar16 != 0) {
          bVar6 = 0 < *(int *)(lVar16 + 0x10);
          if (0 < *(int *)(lVar16 + 0x10)) {
            bVar6 = true;
            lVar13 = 0;
            do {
              pEVar4 = *(EntryPointInfo **)(*(long *)(lVar16 + 8) + lVar13 * 8);
              if ((pEVar4 != (EntryPointInfo *)0x0) &&
                 (((SVar8 = EntryPointInfo::GetState(pEVar4), SVar8 == CodeGenPending ||
                   (SVar8 = EntryPointInfo::GetState(pEVar4), SVar8 == CodeGenQueued)) ||
                  ((SVar8 = EntryPointInfo::GetState(pEVar4), SVar8 == CodeGenRecorded ||
                   ((SVar8 = EntryPointInfo::GetState(pEVar4), SVar8 == CodeGenDone &&
                    ((pEVar4->field_0x18 & 0x10) == 0)))))))) break;
              lVar13 = lVar13 + 1;
              bVar6 = lVar13 < *(int *)(lVar16 + 0x10);
            } while (lVar13 < *(int *)(lVar16 + 0x10));
          }
          if (bVar6) {
            bVar6 = true;
            goto LAB_007670ad;
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar9);
    }
    bVar6 = false;
  }
LAB_007670ad:
  return (bool)(bVar6 ^ 1);
}

Assistant:

bool FunctionBody::DoRedeferFunction(uint inactiveThreshold) const
    {
        if (!(this->GetFunctionInfo()->GetFunctionProxy() == this &&
              this->CanBeDeferred() &&
              this->GetByteCode() &&
              this->GetCanDefer()))
        {
            return false;
        }

        if (!PHASE_FORCE(Js::RedeferralPhase, this) && !PHASE_STRESS(Js::RedeferralPhase, this))
        {
            uint compileCount = this->GetCompileCount();
            if (compileCount >= (uint)CONFIG_FLAG(RedeferralCap))
            {
                return false;
            }
            // Redeferral threshold is k^x, where x is the number of previous compiles.
            bool overflow = false;
            uint currentThreshold = inactiveThreshold;
            if (compileCount > 1)
            {
                currentThreshold = JavascriptNumber::DirectPowIntInt(&overflow, inactiveThreshold, compileCount);
            }
            if (overflow)
            {
                currentThreshold = 0xFFFFFFFF;
            }
            if (this->GetInactiveCount() < currentThreshold)
            {
                return false;
            }
        }

        // Make sure the function won't be jitted
        bool isJitCandidate = false;
#if ENABLE_NATIVE_CODEGEN
        bool isJitModeFunction = !this->IsInterpreterExecutionMode();
        isJitCandidate = MapEntryPointsUntil([=](int index, FunctionEntryPointInfo *entryPointInfo)
        {
            if ((entryPointInfo->IsCodeGenPending() && isJitModeFunction) || entryPointInfo->IsCodeGenQueued() || entryPointInfo->IsCodeGenRecorded() || (entryPointInfo->IsCodeGenDone() && !entryPointInfo->IsNativeEntryPointProcessed()))
            {
                return true;
            }
            return false;
        });

        if (!isJitCandidate)
        {
            // Now check loop body entry points
            isJitCandidate = MapLoopHeadersUntil([=](uint loopNumber, LoopHeader* header)
            {
                return header->MapEntryPointsUntil([&](int index, LoopEntryPointInfo* entryPointInfo)
                {
                    if (entryPointInfo->IsCodeGenPending() || entryPointInfo->IsCodeGenQueued() || entryPointInfo->IsCodeGenRecorded() || (entryPointInfo->IsCodeGenDone() && !entryPointInfo->IsNativeEntryPointProcessed()))
                    {
                        return true;
                    }
                    return false;
                });
            });
        }
#endif

        return !isJitCandidate;
    }